

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O2

edge_const_shared_ptr_t __thiscall
tchecker::syncprod::edges_iterator_t::operator*(edges_iterator_t *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  edge_const_shared_ptr_t eVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (in_RSI->_M_ptr == (element_type *)0x0) {
    eVar2 = cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
            ::values_iterator_t::operator*((values_iterator_t *)this);
    _Var1 = eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::__shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2> *)this,
               in_RSI);
    _Var1._M_pi = extraout_RDX;
  }
  eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (edge_const_shared_ptr_t)
         eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

tchecker::system::edge_const_shared_ptr_t edges_iterator_t::operator*()
{
  if (_async_edge.get() == nullptr)
    return *_sync_it;
  return _async_edge;
}